

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O0

void write_keymap(void)

{
  nh_bool nVar1;
  int __fd;
  size_t sVar2;
  nh_cmd_desc *local_230;
  nh_cmd_desc *local_228;
  char *name;
  char buf [256];
  fnchar filename [256];
  wchar_t local_10;
  uint key;
  wchar_t i;
  wchar_t fd;
  
  buf[0xf8] = '\0';
  nVar1 = get_gamedir(CONFIG_DIR,buf + 0xf8);
  if (nVar1 != '\0') {
    strncat(buf + 0xf8,"keymap.conf",0x100);
    __fd = open(buf + 0xf8,0x242,0x1a4);
    if (__fd != -1) {
      fchmod(__fd,0x1a4);
      filename[0xfc] = '\x01';
      filename[0xfd] = '\0';
      filename[0xfe] = '\0';
      filename[0xff] = '\0';
      for (; (uint)filename._252_4_ < 0x1ff; filename._252_4_ = filename._252_4_ + 1) {
        if (keymap[(uint)filename._252_4_] == (nh_cmd_desc *)0x0) {
          if (unknown_keymap[(uint)filename._252_4_] == (nh_cmd_desc *)0x0) {
            local_230 = (nh_cmd_desc *)0x123e17;
          }
          else {
            local_230 = unknown_keymap[(uint)filename._252_4_];
          }
          local_228 = local_230;
        }
        else {
          local_228 = keymap[(uint)filename._252_4_];
        }
        sprintf((char *)&name,"%x %s\n",(ulong)(uint)filename._252_4_,local_228);
        sVar2 = strlen((char *)&name);
        write(__fd,&name,sVar2);
      }
      for (local_10 = L'\0'; local_10 < cmdcount; local_10 = local_10 + L'\x01') {
        if ((commandlist[local_10].flags & 0x400) == 0) {
          sprintf((char *)&name,"NOEXT %s\n",commandlist + local_10);
          sVar2 = strlen((char *)&name);
          write(__fd,&name,sVar2);
        }
        else {
          sprintf((char *)&name,"EXT %s\n",commandlist + local_10);
          sVar2 = strlen((char *)&name);
          write(__fd,&name,sVar2);
        }
      }
      for (local_10 = L'\0'; local_10 < unknown_count; local_10 = local_10 + L'\x01') {
        if ((unknown_commands[local_10].flags & 0x400) == 0) {
          sprintf((char *)&name,"NOEXT %s\n",unknown_commands + local_10);
          sVar2 = strlen((char *)&name);
          write(__fd,&name,sVar2);
        }
        else {
          sprintf((char *)&name,"EXT %s\n",unknown_commands + local_10);
          sVar2 = strlen((char *)&name);
          write(__fd,&name,sVar2);
        }
      }
      close(__fd);
    }
  }
  return;
}

Assistant:

static void write_keymap(void)
{
    int fd, i;
    unsigned int key;
    fnchar filename[BUFSZ];
    char buf[BUFSZ], *name;
    
    filename[0] = '\0';
    if (!get_gamedir(CONFIG_DIR, filename))
	return;
    fnncat(filename, FN("keymap.conf"), BUFSZ);

    fd = sys_open(filename, O_TRUNC | O_CREAT | O_RDWR, 0644);
    if (fd == -1)
	return;
#ifdef UNIX
    /* bypass umask and set 0644 for real */
    fchmod(fd, 0644);
#endif

    for (key = 1; key < KEY_MAX; key++) {
	name = keymap[key] ? keymap[key]->name :
	                (unknown_keymap[key] ? unknown_keymap[key]->name : "-");
	sprintf(buf, "%x %s\n", key, name);
	write(fd, buf, strlen(buf));
    }
    
    for (i = 0; i < cmdcount; i++) {
	if (commandlist[i].flags & CMD_EXT) {
	    sprintf(buf, "EXT %s\n", commandlist[i].name);
	    write(fd, buf, strlen(buf));
	} else {
	    sprintf(buf, "NOEXT %s\n", commandlist[i].name);
	    write(fd, buf, strlen(buf));
	}
    }
    
    for (i = 0; i < unknown_count; i++) {
	if (unknown_commands[i].flags & CMD_EXT) {
	    sprintf(buf, "EXT %s\n", unknown_commands[i].name);
	    write(fd, buf, strlen(buf));
	} else {
	    sprintf(buf, "NOEXT %s\n", unknown_commands[i].name);
	    write(fd, buf, strlen(buf));
	}
    }
    
    close(fd);
}